

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall
CRegexSearcherSimple::compile_and_match
          (CRegexSearcherSimple *this,char *patstr,size_t patlen,char *entirestr,char *searchstr,
          size_t searchlen)

{
  re_status_t rVar1;
  int iVar2;
  int iVar3;
  re_compiled_pattern_base pat;
  short loop_vars [20];
  
  this->group_cnt_ = 0;
  clear_group_regs(this);
  rVar1 = CRegexParser::compile(this->parser_,patstr,patlen,&pat);
  iVar2 = 0;
  if (rVar1 == RE_STATUS_SUCCESS) {
    this->group_cnt_ = pat.group_cnt;
    iVar2 = CRegexSearcher::match
                      (&this->super_CRegexSearcher,entirestr,
                       searchlen + ((long)searchstr - (long)entirestr),searchstr,searchlen,&pat,
                       this->parser_->tuple_arr_,&pat.machine,
                       (re_group_register_conflict *)&(this->super_CRegexSearcher).field_0x24,
                       loop_vars);
    if (-1 < iVar2) {
      iVar3 = (int)((long)searchstr - (long)entirestr);
      (this->match_).start_ofs = iVar3;
      (this->match_).end_ofs = iVar2 + iVar3;
    }
  }
  return iVar2;
}

Assistant:

int CRegexSearcherSimple::compile_and_match(
    const char *patstr, size_t patlen,
    const char *entirestr, const char *searchstr, size_t searchlen)
{
    re_compiled_pattern_base pat;
    short loop_vars[RE_LOOP_VARS_MAX];

    /* no groups yet */
    group_cnt_ = 0;

    /* clear the group registers */
    clear_group_regs();

    /* compile the expression - return failure if we get an error */
    if (parser_->compile(patstr, patlen, &pat) != RE_STATUS_SUCCESS)
        return FALSE;

    /* remember the group count from the compiled pattern */
    group_cnt_ = pat.group_cnt;

    /* match the string */
    int m = match(entirestr, searchlen + (searchstr - entirestr),
                  searchstr, searchlen,
                  &pat, parser_->tuple_arr_, &pat.machine, regs_, loop_vars);

    /* save the match information on success */
    if (m >= 0)
    {
        match_.start_ofs = searchstr - entirestr;
        match_.end_ofs = match_.start_ofs + m;
    }

    /* return the result */
    return m;
}